

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetWritable
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          BOOL value)

{
  byte bVar1;
  BOOL BVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  bool local_42;
  bool local_41;
  int local_34;
  undefined1 local_30 [4];
  BOOL isNumericPropertyId;
  int local_28;
  PropertyId local_24;
  BOOL value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  local_28 = value;
  local_24 = propertyId;
  _value_local = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  if (propertyId == 0xd1) {
    SetLengthWritable(this,(bool)(-(value != 0) & 1));
    if (local_28 == 0) {
      bVar1 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
      if ((bVar1 & 0x20) != 0) {
        RecyclableObject::GetLibrary((RecyclableObject *)_value_local);
        JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                  ((JavascriptLibrary *)local_30);
        this_00 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                  operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                              *)local_30);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
      }
    }
    this_local._4_4_ = 1;
  }
  else {
    BVar2 = UpdateAttribute(this,instance,propertyId,'\x04',value,&local_34);
    local_41 = true;
    if (BVar2 == 0) {
      local_42 = false;
      if (local_34 == 0) {
        BVar2 = DictionaryTypeHandlerBase<int>::SetWritable
                          (&this->super_DictionaryTypeHandlerBase<int>,(DynamicObject *)_value_local
                           ,local_24,local_28);
        local_42 = BVar2 != 0;
      }
      local_41 = local_42;
    }
    this_local._4_4_ = (uint)local_41;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        if (propertyId == PropertyIds::length)
        {
            SetLengthWritable(value ? true : false);
            if(!value && this->GetFlags() & this->IsPrototypeFlag)
            {
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
            }
            return true;
        }

        BOOL isNumericPropertyId;
        return UpdateAttribute(instance, propertyId, PropertyWritable, value, isNumericPropertyId)
            || (!isNumericPropertyId && __super::SetWritable(instance, propertyId, value));
    }